

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O1

void cinatra::finish<void>(sha1_context *ctx,void *digest)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t i_1;
  size_t i;
  long lVar6;
  uint32_t block [16];
  uint32_t local_58 [14];
  ulong local_20;
  
  sVar3 = ctx->buflen;
  sVar4 = ctx->blocks;
  ctx->buflen = sVar3 + 1;
  ctx->buf[sVar3] = 0x80;
  uVar5 = ctx->buflen;
  if (uVar5 < 0x40) {
    lVar6 = uVar5 - 0x40;
    do {
      ctx->buflen = lVar6 + 0x41;
      ctx->buf[lVar6 + 0x40] = '\0';
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
  }
  uVar1 = sVar4 * 0x200 + sVar3 * 8;
  lVar6 = 0;
  do {
    uVar2 = *(uint *)(ctx->buf + lVar6 * 4);
    local_58[lVar6] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  if (0x38 < uVar5) {
    sha1::transform<void>(ctx->digest,local_58);
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
  }
  local_20 = uVar1 >> 0x20 | uVar1 << 0x20;
  sha1::transform<void>(ctx->digest,local_58);
  lVar6 = 0;
  do {
    *(char *)((long)digest + lVar6 * 4 + 3) = (char)ctx->digest[lVar6];
    *(undefined1 *)((long)digest + lVar6 * 4 + 2) =
         *(undefined1 *)((long)ctx->digest + lVar6 * 4 + 1);
    *(undefined1 *)((long)digest + lVar6 * 4 + 1) =
         *(undefined1 *)((long)ctx->digest + lVar6 * 4 + 2);
    *(undefined1 *)((long)digest + lVar6 * 4) = *(undefined1 *)((long)ctx->digest + lVar6 * 4 + 3);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

inline void finish(sha1_context &ctx, void *digest) noexcept {
  using sha1::BLOCK_BYTES;
  using sha1::BLOCK_INTS;

  std::uint64_t total_bits = (ctx.blocks * 64 + ctx.buflen) * 8;
  // pad
  ctx.buf[ctx.buflen++] = 0x80;
  auto const buflen = ctx.buflen;
  while (ctx.buflen < 64) ctx.buf[ctx.buflen++] = 0x00;
  std::uint32_t block[BLOCK_INTS];
  sha1::make_block(ctx.buf, block);
  if (buflen > BLOCK_BYTES - 8) {
    sha1::transform(ctx.digest, block);
    for (size_t i = 0; i < BLOCK_INTS - 2; i++) block[i] = 0;
  }

  /* Append total_bits, split this uint64_t into two uint32_t */
  block[BLOCK_INTS - 1] = total_bits & 0xffffffff;
  block[BLOCK_INTS - 2] = (total_bits >> 32);
  sha1::transform(ctx.digest, block);
  for (std::size_t i = 0; i < sha1::DIGEST_BYTES / 4; i++) {
    std::uint8_t *d = reinterpret_cast<std::uint8_t *>(digest) + 4 * i;
    d[3] = ctx.digest[i] & 0xff;
    d[2] = (ctx.digest[i] >> 8) & 0xff;
    d[1] = (ctx.digest[i] >> 16) & 0xff;
    d[0] = (ctx.digest[i] >> 24) & 0xff;
  }
}